

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O1

void __thiscall
level_mesh::push(level_mesh *this,uint16_t sector,xr_vbuf *vb,xr_ibuf *ib,uint16_t texture,
                uint16_t eshader,fmatrix *xform)

{
  anon_union_48_3_fb61167d_for_b_face_0 local_48;
  uint16_t uStack_18;
  uint16_t uStack_16;
  undefined2 uStack_14;
  undefined2 local_12;
  undefined4 local_10;
  uint16_t local_a;
  
  local_10 = 0xffffffff;
  local_48.field_0.v[0] = 0xffffffff;
  local_48.field_0.v[1] = 0xffffffff;
  local_48.field_0.v[2] = 0xffffffff;
  local_48.field_0.n[0] = 0xffffffff;
  local_48.field_0.n[1] = 0xffffffff;
  local_48.field_0.n[2] = 0xffffffff;
  local_48.field_0.tc[0] = 0xffffffff;
  local_48.field_0.tc[1] = 0xffffffff;
  local_48.field_0.tc[2] = 0xffffffff;
  local_48.field_0.link[0] = 0xffffffff;
  local_48.field_0.link[1] = 0xffffffff;
  local_48.field_0.link[2]._0_2_ = 0xffff;
  local_48.field_0.link[2]._2_2_ = 0xffff;
  uStack_14 = 0xffff;
  local_12 = 2;
  if ((vb->m_signature & 8) != 0) {
    local_12 = 6;
  }
  uStack_18 = texture;
  uStack_16 = eshader;
  local_a = sector;
  xray_re::xr_mesh_builder::__push
            (&this->super_xr_mesh_builder,vb,ib,xform,(b_face *)&local_48.field_0,0);
  return;
}

Assistant:

void level_mesh::push(uint16_t sector, const xr_vbuf& vb, const xr_ibuf& ib,
	uint16_t texture, uint16_t eshader, const fmatrix& xform)
{
	b_face face_template(sector);
	face_template.surface.set(texture, eshader);
	if (vb.has_lightmaps())
		face_template.surface.flags |= RSF_LIGHTMAP;
	xr_mesh_builder::__push(vb, ib, &xform, face_template);
}